

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsgf.c
# Opt level: O1

void jsgf_grammar_free(jsgf_t *jsgf)

{
  hash_iter_t *phVar1;
  glist_t pgVar2;
  
  if (jsgf->parent == (jsgf_t *)0x0) {
    for (phVar1 = hash_table_iter(jsgf->rules); phVar1 != (hash_iter_t *)0x0;
        phVar1 = hash_table_iter_next(phVar1)) {
      ckd_free(phVar1->ent->key);
      jsgf_rule_free((jsgf_rule_t *)phVar1->ent->val);
    }
    hash_table_free(jsgf->rules);
    for (phVar1 = hash_table_iter(jsgf->imports); phVar1 != (hash_iter_t *)0x0;
        phVar1 = hash_table_iter_next(phVar1)) {
      ckd_free(phVar1->ent->key);
      jsgf_grammar_free((jsgf_t *)phVar1->ent->val);
    }
    hash_table_free(jsgf->imports);
    for (pgVar2 = jsgf->searchpath; pgVar2 != (glist_t)0x0; pgVar2 = pgVar2->next) {
      ckd_free((pgVar2->data).ptr);
    }
    glist_free(jsgf->searchpath);
    for (pgVar2 = jsgf->links; pgVar2 != (glist_t)0x0; pgVar2 = pgVar2->next) {
      ckd_free((pgVar2->data).ptr);
    }
    glist_free(jsgf->links);
  }
  ckd_free(jsgf->name);
  ckd_free(jsgf->version);
  ckd_free(jsgf->charset);
  ckd_free(jsgf->locale);
  ckd_free(jsgf);
  return;
}

Assistant:

void
jsgf_grammar_free(jsgf_t * jsgf)
{
    /* FIXME: Probably should just use refcounting instead. */
    if (jsgf->parent == NULL) {
        hash_iter_t *itor;
        gnode_t *gn;

        for (itor = hash_table_iter(jsgf->rules); itor;
             itor = hash_table_iter_next(itor)) {
            ckd_free((char *) itor->ent->key);
            jsgf_rule_free((jsgf_rule_t *) itor->ent->val);
        }
        hash_table_free(jsgf->rules);
        for (itor = hash_table_iter(jsgf->imports); itor;
             itor = hash_table_iter_next(itor)) {
            ckd_free((char *) itor->ent->key);
            jsgf_grammar_free((jsgf_t *) itor->ent->val);
        }
        hash_table_free(jsgf->imports);
        for (gn = jsgf->searchpath; gn; gn = gnode_next(gn))
            ckd_free(gnode_ptr(gn));
        glist_free(jsgf->searchpath);
        for (gn = jsgf->links; gn; gn = gnode_next(gn))
            ckd_free(gnode_ptr(gn));
        glist_free(jsgf->links);
    }
    ckd_free(jsgf->name);
    ckd_free(jsgf->version);
    ckd_free(jsgf->charset);
    ckd_free(jsgf->locale);
    ckd_free(jsgf);
}